

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
::StoreSolverExpression
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
           *this,BasicFlatModelAPI *be,int i,void *pexpr)

{
  void *pexpr_local;
  int i_local;
  BasicFlatModelAPI *be_local;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  *this_local;
  
  return;
}

Assistant:

void StoreSolverExpression(
      BasicFlatModelAPI& be, int i, void* pexpr) override {
    if constexpr (ExpressionAcceptanceLevel::NotAccepted
        != Backend::ExpressionInterfaceAcceptanceLevel()) {
      assert(!cons_[i].IsRedundant());
      assert(!cons_[i].IsExprAdded());
      cons_[i].MarkExprAdded();
      *(typename Backend::Expr*)pexpr =
          static_cast<Backend&>(be).AddExpression(cons_[i].GetExpr());
    }
  }